

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O0

void jsonnet_tla_var(JsonnetVm *vm,char *key,char *val)

{
  mapped_type *this;
  VmExt *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  undefined1 is_code;
  string *in_stack_ffffffffffffff38;
  VmExt *in_stack_ffffffffffffff40;
  allocator<char> *in_stack_ffffffffffffff60;
  key_type *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  allocator<char> local_61;
  string local_60 [96];
  
  is_code = (undefined1)((ulong)in_stack_ffffffffffffff30 >> 0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  jsonnet::internal::VmExt::VmExt(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(bool)is_code)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
                       *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  jsonnet::internal::VmExt::operator=(this,in_stack_ffffffffffffff28);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
  jsonnet::internal::VmExt::~VmExt((VmExt *)0x1dd293);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  return;
}

Assistant:

void jsonnet_tla_var(JsonnetVm *vm, const char *key, const char *val)
{
    vm->tla[key] = VmExt(val, false);
}